

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYRef<unsigned_long_long> *getter2,TransformerLogLog *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  TransformerLogLog *pTVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  ImPlotContext *pIVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar7 = getter1->Count;
  iVar17 = getter2->Count;
  if (iVar7 < getter2->Count) {
    iVar17 = iVar7;
  }
  this->Prims = iVar17 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar16 = GImPlot;
  (this->P12).y = 0.0;
  lVar18 = (long)((getter1->Offset % iVar7 + iVar7) % iVar7) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar18);
  auVar19._8_4_ = (int)(uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._12_4_ = 0x45300000;
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar18);
  auVar20._8_4_ = (int)(uVar2 >> 0x20);
  auVar20._0_8_ = uVar2;
  auVar20._12_4_ = 0x45300000;
  dVar13 = log10(((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar16->CurrentPlot;
  dVar3 = pIVar16->LogDenX;
  dVar4 = (pIVar8->XAxis).Range.Min;
  dVar5 = (pIVar8->XAxis).Range.Max;
  dVar14 = log10(((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 pIVar8->YAxis[transformer->YAxis].Range.Min);
  iVar7 = transformer->YAxis;
  pIVar8 = pIVar16->CurrentPlot;
  auVar21._8_8_ = dVar14;
  auVar21._0_8_ = dVar13;
  auVar22._8_8_ = pIVar16->LogDenY[iVar7];
  auVar22._0_8_ = dVar3;
  auVar22 = divpd(auVar21,auVar22);
  dVar3 = pIVar8->YAxis[iVar7].Range.Min;
  IVar6 = pIVar16->PixelRange[iVar7].Min;
  IVar11.y = (float)(pIVar16->My[iVar7] *
                     (((double)(float)auVar22._8_8_ * (pIVar8->YAxis[iVar7].Range.Max - dVar3) +
                      dVar3) - dVar3) + (double)IVar6.y);
  IVar11.x = (float)(pIVar16->Mx *
                     (((double)(float)auVar22._0_8_ * (dVar5 - dVar4) + dVar4) -
                     (pIVar8->XAxis).Range.Min) + (double)IVar6.x);
  this->P11 = IVar11;
  pIVar16 = GImPlot;
  pGVar9 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)((pGVar9->Offset % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride);
  auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
  auVar23._8_4_ = (int)(uVar1 >> 0x20);
  auVar23._12_4_ = 0x45300000;
  dVar3 = pGVar9->YRef;
  dVar14 = log10(((auVar23._8_8_ - 1.9342813113834067e+25) + (auVar23._0_8_ - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar16->CurrentPlot;
  dVar4 = pIVar16->LogDenX;
  dVar5 = (pIVar8->XAxis).Range.Min;
  dVar13 = (pIVar8->XAxis).Range.Max;
  dVar3 = log10(dVar3 / pIVar8->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar8 = pIVar16->CurrentPlot;
  auVar24._8_8_ = dVar3;
  auVar24._0_8_ = dVar14;
  auVar15._8_8_ = pIVar16->LogDenY[iVar7];
  auVar15._0_8_ = dVar4;
  auVar22 = divpd(auVar24,auVar15);
  dVar3 = pIVar8->YAxis[iVar7].Range.Min;
  IVar6 = pIVar16->PixelRange[iVar7].Min;
  IVar12.y = (float)(pIVar16->My[iVar7] *
                     (((double)(float)auVar22._8_8_ * (pIVar8->YAxis[iVar7].Range.Max - dVar3) +
                      dVar3) - dVar3) + (double)IVar6.y);
  IVar12.x = (float)(pIVar16->Mx *
                     (((double)(float)auVar22._0_8_ * (dVar13 - dVar5) + dVar5) -
                     (pIVar8->XAxis).Range.Min) + (double)IVar6.x);
  this->P12 = IVar12;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }